

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_msg_chop_u32(nng_msg *m,uint32_t *vp)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  
  sVar3 = nni_msg_len(m);
  if (sVar3 < 4) {
    iVar2 = 3;
  }
  else {
    pvVar4 = nni_msg_body(m);
    sVar3 = nni_msg_len(m);
    uVar1 = *(uint *)((long)pvVar4 + (sVar3 - 4));
    nni_msg_chop(m,4);
    *vp = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
nng_msg_chop_u32(nng_msg *m, uint32_t *vp)
{
	uint8_t *body;
	uint32_t v;
	if (nni_msg_len(m) < sizeof(*vp)) {
		return (NNG_EINVAL);
	}
	body = nni_msg_body(m);
	body += nni_msg_len(m);
	body -= sizeof(v);
	NNI_GET32(body, v);
	(void) nni_msg_chop(m, sizeof(v));
	*vp = v;
	return (0);
}